

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O1

void __thiscall
t_ocaml_generator::generate_ocaml_function_helpers(t_ocaml_generator *this,t_function *tfunction)

{
  t_program *program;
  pointer pcVar1;
  t_type *type;
  t_struct *ptVar2;
  char *pcVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  pointer pptVar7;
  t_field success;
  t_struct result;
  char *local_208;
  undefined8 local_200;
  char local_1f8 [8];
  undefined8 uStack_1f0;
  char *local_1e8;
  undefined8 local_1e0;
  char local_1d8 [8];
  undefined8 uStack_1d0;
  string local_1c8;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_190 [9];
  t_struct local_f8;
  
  program = (this->super_t_oop_generator).super_t_generator.program_;
  pcVar1 = (tfunction->name_)._M_dataplus._M_p;
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar1,pcVar1 + (tfunction->name_)._M_string_length);
  pcVar3 = local_208;
  iVar4 = tolower((int)*local_208);
  *pcVar3 = (char)iVar4;
  if (local_208 == local_1f8) {
    uStack_1d0 = uStack_1f0;
    local_1e8 = local_1d8;
  }
  else {
    local_1e8 = local_208;
  }
  local_1e0 = local_200;
  local_200 = 0;
  local_1f8[0] = '\0';
  local_208 = local_1f8;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    local_1a8._16_8_ = *psVar6;
    aaStack_190[0]._0_8_ = plVar5[3];
    local_1a8._0_8_ = local_1a8 + 0x10;
  }
  else {
    local_1a8._16_8_ = *psVar6;
    local_1a8._0_8_ = (size_type *)*plVar5;
  }
  local_1a8._8_8_ = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  t_struct::t_struct(&local_f8,program,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208);
  }
  type = tfunction->returntype_;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"success","");
  t_field::t_field((t_field *)local_1a8,type,&local_1c8,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
  if ((char)iVar4 == '\0') {
    t_struct::append(&local_f8,(t_field *)local_1a8);
  }
  ptVar2 = tfunction->xceptions_;
  pptVar7 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      t_struct::append(&local_f8,*pptVar7);
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  generate_ocaml_struct_definition(this,(ostream *)&this->f_service_,&local_f8,false);
  t_field::~t_field((t_field *)local_1a8);
  local_f8.super_t_type.super_t_doc._vptr_t_doc = (_func_int **)&PTR__t_struct_0040eef0;
  if (local_f8.members_in_id_order_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.members_in_id_order_.
                    super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  t_type::~t_type(&local_f8.super_t_type);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_function_helpers(t_function* tfunction) {
  t_struct result(program_, decapitalize(tfunction->get_name()) + "_result");
  t_field success(tfunction->get_returntype(), "success", 0);
  if (!tfunction->get_returntype()->is_void()) {
    result.append(&success);
  }

  t_struct* xs = tfunction->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    result.append(*f_iter);
  }
  generate_ocaml_struct_definition(f_service_, &result, false);
}